

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

size_t ma_dr_wav_write_raw(ma_dr_wav *pWav,size_t bytesToWrite,void *pData)

{
  size_t sVar1;
  
  if (pData == (void *)0x0 || (bytesToWrite == 0 || pWav == (ma_dr_wav *)0x0)) {
    return 0;
  }
  sVar1 = (*pWav->onWrite)(pWav->pUserData,pData,bytesToWrite);
  pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar1;
  return sVar1;
}

Assistant:

MA_API size_t ma_dr_wav_write_raw(ma_dr_wav* pWav, size_t bytesToWrite, const void* pData)
{
    size_t bytesWritten;
    if (pWav == NULL || bytesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesWritten = pWav->onWrite(pWav->pUserData, pData, bytesToWrite);
    pWav->dataChunkDataSize += bytesWritten;
    return bytesWritten;
}